

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_wrapper.hpp
# Opt level: O1

void __thiscall duckdb::MiniZStream::~MiniZStream(MiniZStream *this)

{
  if (this->type == MINIZ_TYPE_DEFLATE) {
    duckdb_miniz::mz_deflateEnd(&this->stream);
  }
  else if (this->type == MINIZ_TYPE_INFLATE) {
    duckdb_miniz::mz_inflateEnd(&this->stream);
  }
  return;
}

Assistant:

~MiniZStream() {
		switch (type) {
		case MiniZStreamType::MINIZ_TYPE_INFLATE:
			duckdb_miniz::mz_inflateEnd(&stream);
			break;
		case MiniZStreamType::MINIZ_TYPE_DEFLATE:
			duckdb_miniz::mz_deflateEnd(&stream);
			break;
		default:
			break;
		}
	}